

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O0

int CoreVfprintf(CPalThread *pthrCurrent,PAL_FILE *stream,char *format,__va_list_tag *aparg)

{
  long lVar1;
  void *pvVar2;
  char *__s;
  FILE *pFVar3;
  undefined8 uVar4;
  LPWSTR this;
  BOOL BVar5;
  uint cbMultiByte;
  DWORD DVar6;
  int iVar7;
  INT IVar8;
  size_t sVar9;
  LPINT in_R9;
  long in_FS_OFFSET;
  undefined4 *local_698;
  undefined4 *local_680;
  undefined8 *local_668;
  undefined4 *local_650;
  undefined8 *local_638;
  undefined8 *local_618;
  INT *local_5f8;
  INT *local_5e0;
  undefined4 *local_5c0;
  undefined8 *local_560;
  INT *local_530;
  INT *local_500;
  undefined1 auStack_4e8 [8];
  va_list apcopy;
  short s;
  int n;
  short trunc2;
  long trunc1;
  char *tempStr;
  undefined1 uStack_4a8;
  char ch [2];
  CHAR TempBuffer [5];
  va_list ap;
  int local_480;
  int paddingReturnValue;
  int written;
  int wctombResult;
  INT TempInt;
  INT Length;
  INT Type;
  INT Prefix;
  INT Precision;
  INT Width;
  INT Flags;
  WCHAR TempWChar;
  LPSTR TempStr;
  LPWSTR TempWStr;
  LPCSTR Fmt;
  __va_list_tag *aparg_local;
  char *format_local;
  PAL_FILE *stream_local;
  CPalThread *pthrCurrent_local;
  CHAR local_418 [8];
  CHAR TempBuff [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_480 = 0;
  pvVar2 = aparg->reg_save_area;
  _uStack_4a8 = aparg->gp_offset;
  TempBuffer._1_4_ = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  TempWStr = (LPWSTR)format;
  Fmt = (LPCSTR)aparg;
  aparg_local = (__va_list_tag *)format;
  format_local = (char *)stream;
  stream_local = (PAL_FILE *)pthrCurrent;
LAB_001313b8:
  if ((char)*TempWStr == '\0') {
    pthrCurrent_local._4_4_ = local_480;
    goto LAB_00132428;
  }
  if ((char)*TempWStr == '%') {
    in_R9 = &Type;
    BVar5 = Internal_ExtractFormatA
                      ((CPalThread *)stream_local,(LPCSTR *)&TempWStr,local_418,&Precision,&Prefix,
                       in_R9,&Length,&TempInt);
    uVar4 = _uStack_4a8;
    if (BVar5 != 1) goto LAB_00132399;
    if ((Length == 2) && (TempInt == 2)) {
      if (Prefix == -2) {
        if (_uStack_4a8 < 0x29) {
          local_500 = (INT *)((long)(int)_uStack_4a8 + (long)pvVar2);
          _uStack_4a8 = _uStack_4a8 + 8;
        }
        else {
          local_500 = (INT *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Prefix = *local_500;
      }
      else if (Prefix == -3) {
        if (_uStack_4a8 < 0x29) {
          _uStack_4a8 = _uStack_4a8 + 8;
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      if (Type == -2) {
        if (_uStack_4a8 < 0x29) {
          local_530 = (INT *)((long)(int)_uStack_4a8 + (long)pvVar2);
          _uStack_4a8 = _uStack_4a8 + 8;
        }
        else {
          local_530 = (INT *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Type = *local_530;
      }
      else if (Type == -4) {
        if (_uStack_4a8 < 0x29) {
          _uStack_4a8 = _uStack_4a8 + 8;
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      if (_uStack_4a8 < 0x29) {
        local_560 = (undefined8 *)((long)(int)_uStack_4a8 + (long)pvVar2);
        _uStack_4a8 = _uStack_4a8 + 8;
      }
      else {
        local_560 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      TempStr = (LPSTR)*local_560;
      in_R9 = (LPINT)0x0;
      cbMultiByte = WideCharToMultiByte(0,0,(LPCWSTR)TempStr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0
                                       );
      if (cbMultiByte == 0) {
        fprintf(_stderr,"] %s %s:%d","CoreVfprintf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                ,0x8fb);
        pFVar3 = _stderr;
        DVar6 = GetLastError();
        fprintf(pFVar3,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar6);
        pthrCurrent_local._4_4_ = -1;
      }
      else {
        _Flags = (LPSTR)CorUnix::InternalMalloc((long)(int)cbMultiByte);
        if (_Flags != (LPSTR)0x0) {
          if (Type == -3) {
            *_Flags = '\0';
            wctombResult = 0;
          }
          else if ((Type < 1) || ((int)(cbMultiByte - 1) <= Type)) {
            in_R9 = (LPINT)(ulong)cbMultiByte;
            iVar7 = WideCharToMultiByte(0,0,(LPCWSTR)TempStr,-1,_Flags,cbMultiByte,(LPCSTR)0x0,
                                        (LPBOOL)0x0);
            if (iVar7 == 0) {
              fprintf(_stderr,"] %s %s:%d","CoreVfprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,0x928);
              pFVar3 = _stderr;
              DVar6 = GetLastError();
              fprintf(pFVar3,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar6);
              CorUnix::InternalFree(_Flags);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_00132428;
            }
            wctombResult = cbMultiByte - 1;
          }
          else {
            in_R9 = (LPINT)(ulong)cbMultiByte;
            iVar7 = WideCharToMultiByte(0,0,(LPCWSTR)TempStr,Type,_Flags,cbMultiByte,(LPCSTR)0x0,
                                        (LPBOOL)0x0);
            if (iVar7 == 0) {
              fprintf(_stderr,"] %s %s:%d","CoreVfprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,0x917);
              pFVar3 = _stderr;
              DVar6 = GetLastError();
              fprintf(pFVar3,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar6);
              CorUnix::InternalFree(_Flags);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_00132428;
            }
            _Flags[iVar7] = '\0';
            wctombResult = Type;
          }
          IVar8 = Internal_AddPaddingVfprintf
                            ((CPalThread *)stream_local,(PAL_FILE *)format_local,_Flags,
                             Prefix - wctombResult,Precision);
          if (IVar8 == -1) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            CorUnix::InternalFree(_Flags);
            pthrCurrent_local._4_4_ = -1;
            goto LAB_00132428;
          }
          local_480 = IVar8 + local_480;
          CorUnix::InternalFree(_Flags);
          goto LAB_001313b8;
        }
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        CorUnix::CPalThread::SetLastError(8);
        pthrCurrent_local._4_4_ = -1;
      }
    }
    else {
      if ((Length != 2) || (TempInt != 1)) {
        if (TempInt == 6) {
          if (Prefix == -2) {
            if (_uStack_4a8 < 0x29) {
              local_5e0 = (INT *)((long)(int)_uStack_4a8 + (long)pvVar2);
              _uStack_4a8 = _uStack_4a8 + 8;
            }
            else {
              local_5e0 = (INT *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            Prefix = *local_5e0;
          }
          if (Type == -2) {
            if (_uStack_4a8 < 0x29) {
              local_5f8 = (INT *)((long)(int)_uStack_4a8 + (long)pvVar2);
              _uStack_4a8 = _uStack_4a8 + 8;
            }
            else {
              local_5f8 = (INT *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            Type = *local_5f8;
          }
          if (Length == 1) {
            if (_uStack_4a8 < 0x29) {
              local_618 = (undefined8 *)((long)(int)_uStack_4a8 + (long)pvVar2);
              _uStack_4a8 = _uStack_4a8 + 8;
            }
            else {
              local_618 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(short *)*local_618 = (short)local_480;
          }
          else {
            if (_uStack_4a8 < 0x29) {
              local_638 = (undefined8 *)((long)(int)_uStack_4a8 + (long)pvVar2);
              _uStack_4a8 = _uStack_4a8 + 8;
            }
            else {
              local_638 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            *(int *)*local_638 = local_480;
          }
        }
        else if ((TempInt == 1) && ((Precision & 4U) != 0)) {
          if (_uStack_4a8 < 0x29) {
            local_650 = (undefined4 *)((long)(int)_uStack_4a8 + (long)pvVar2);
            _uStack_4a8 = _uStack_4a8 + 8;
          }
          else {
            local_650 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          tempStr._1_1_ = (undefined1)*local_650;
          tempStr._2_1_ = 0;
          IVar8 = Internal_AddPaddingVfprintf
                            ((CPalThread *)stream_local,(PAL_FILE *)format_local,
                             (LPSTR)((long)&tempStr + 1),Prefix + -1,Precision);
          if (IVar8 == -1) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pthrCurrent_local._4_4_ = -1;
            goto LAB_00132428;
          }
          local_480 = IVar8 + local_480;
        }
        else if ((TempInt == 2) && ((Precision & 4U) != 0)) {
          if (_uStack_4a8 < 0x29) {
            local_668 = (undefined8 *)((long)(int)_uStack_4a8 + (long)pvVar2);
            _uStack_4a8 = _uStack_4a8 + 8;
          }
          else {
            local_668 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          __s = (char *)*local_668;
          sVar9 = strlen(__s);
          IVar8 = Internal_AddPaddingVfprintf
                            ((CPalThread *)stream_local,(PAL_FILE *)format_local,__s,
                             Prefix - (int)sVar9,Precision);
          if (IVar8 == -1) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pthrCurrent_local._4_4_ = -1;
            goto LAB_00132428;
          }
          local_480 = IVar8 + local_480;
        }
        else {
          if ((TempInt == 5) && (Length == 1)) {
            if (_uStack_4a8 < 0x29) {
              local_680 = (undefined4 *)((long)(int)_uStack_4a8 + (long)pvVar2);
              _uStack_4a8 = _uStack_4a8 + 8;
            }
            else {
              local_680 = (undefined4 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            written = fprintf(*(FILE **)format_local,local_418,(long)(short)*local_680);
          }
          else if ((TempInt == 4) && (Length == 1)) {
            if (_uStack_4a8 < 0x29) {
              local_698 = (undefined4 *)((long)(int)_uStack_4a8 + (long)pvVar2);
              _uStack_4a8 = _uStack_4a8 + 8;
            }
            else {
              local_698 = (undefined4 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            apcopy[0].reg_save_area._6_2_ = (short)*local_698;
            written = fprintf(*(FILE **)format_local,local_418,
                              (ulong)(uint)(int)apcopy[0].reg_save_area._6_2_);
          }
          else {
            auStack_4e8._0_4_ = _uStack_4a8;
            auStack_4e8[4] = TempBuffer[1];
            auStack_4e8[5] = TempBuffer[2];
            auStack_4e8[6] = TempBuffer[3];
            auStack_4e8[7] = TempBuffer[4];
            apcopy[0].gp_offset = ap[0].gp_offset;
            apcopy[0].fp_offset = ap[0].fp_offset;
            apcopy[0].overflow_arg_area = pvVar2;
            _uStack_4a8 = uVar4;
            written = vfprintf(*(FILE **)format_local,local_418,auStack_4e8);
            PAL_printf_arg_remover((va_list *)&uStack_4a8,Prefix,Type,TempInt,Length);
          }
          if (written == -1) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
          }
          else {
            local_480 = written + local_480;
          }
        }
        goto LAB_001313b8;
      }
      if ((Prefix == -2) || (Prefix == -3)) {
        if (_uStack_4a8 < 0x29) {
          _uStack_4a8 = _uStack_4a8 + 8;
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      if ((Type == -2) || (Type == -4)) {
        if (_uStack_4a8 < 0x29) {
          _uStack_4a8 = _uStack_4a8 + 8;
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      if (_uStack_4a8 < 0x29) {
        local_5c0 = (undefined4 *)((long)(int)_uStack_4a8 + (long)pvVar2);
        _uStack_4a8 = _uStack_4a8 + 8;
      }
      else {
        local_5c0 = (undefined4 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      Width._2_2_ = (undefined2)*local_5c0;
      in_R9 = (LPINT)0x5;
      iVar7 = WideCharToMultiByte(0,0,(LPCWSTR)((long)&Width + 2),1,(LPSTR)((long)&tempStr + 3),5,
                                  (LPCSTR)0x0,(LPBOOL)0x0);
      if (iVar7 != 0) {
        *(undefined1 *)((long)&tempStr + (long)iVar7 + 3) = 0;
        IVar8 = Internal_AddPaddingVfprintf
                          ((CPalThread *)stream_local,(PAL_FILE *)format_local,
                           (LPSTR)((long)&tempStr + 3),Prefix - iVar7,Precision);
        if (IVar8 == -1) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pthrCurrent_local._4_4_ = -1;
          goto LAB_00132428;
        }
        local_480 = IVar8 + local_480;
        goto LAB_001313b8;
      }
      fprintf(_stderr,"] %s %s:%d","CoreVfprintf",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
              ,0x958);
      pFVar3 = _stderr;
      DVar6 = GetLastError();
      fprintf(pFVar3,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar6);
      pthrCurrent_local._4_4_ = -1;
    }
  }
  else {
LAB_00132399:
    this = TempWStr;
    TempWStr = (LPWSTR)((long)TempWStr + 1);
    CorUnix::InternalFwrite
              ((CorUnix *)this,(void *)0x1,1,*(size_t *)format_local,(FILE *)(format_local + 8),
               in_R9);
    if (*(int *)(format_local + 8) != 1) {
      local_480 = local_480 + 1;
      goto LAB_001313b8;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pthrCurrent_local._4_4_ = -1;
  }
LAB_00132428:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pthrCurrent_local._4_4_;
}

Assistant:

int CoreVfprintf(CPalThread *pthrCurrent, PAL_FILE *stream, const char *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCSTR Fmt = format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    int written = 0;
    int paddingReturnValue;
    va_list ap;

    PERF_ENTRY(vfprintf);

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (*Fmt == '%' &&
            TRUE == Internal_ExtractFormatA(pthrCurrent, &Fmt, TempBuff, &Flags,
                                            &Width, &Precision,
                                            &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1, 0,
                                             0, 0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) InternalMalloc(Length);
                if (!TempStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = WideCharToMultiByte(CP_ACP, 0, TempWStr,
                                                 Precision, TempStr, Length,
                                                 0, 0);
                    if (!Length)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        PERF_EXIT(vfprintf);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1,
                                                       TempStr, Length, 0, 0);
                    if (!wctombResult)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        PERF_EXIT(vfprintf);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Internal_AddPaddingVfprintf(pthrCurrent, stream, TempStr,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    InternalFree(TempStr);
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

                InternalFree(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[5];
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = WideCharToMultiByte(CP_ACP, 0, &TempWChar, 1,
                                             TempBuffer, sizeof(TempBuffer),
                                             0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Internal_AddPaddingVfprintf(pthrCurrent, stream, TempBuffer,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of fprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                paddingReturnValue = Internal_AddPaddingVfprintf(
                                                pthrCurrent,
                                                stream,
                                                ch,
                                                Width - Length,
                                                Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of fprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                paddingReturnValue = Internal_AddPaddingVfprintf(
                                                pthrCurrent,
                                                stream,
                                                tempStr,
                                                Width - Length,
                                                Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;
            }
            else
            {
                // Types that fprintf can handle.
                TempInt = 0;

                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = fprintf(stream->bsdFilePtr, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = fprintf( stream->bsdFilePtr, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vfprintf(stream->bsdFilePtr, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (-1 == TempInt)
                {
                    ERROR("vfprintf returned an error\n");
                }
                else
                {
                    written += TempInt;
                }
            }
        }
        else
        {

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
            clearerr (stream->bsdFilePtr);
#endif

            InternalFwrite(Fmt++, 1, 1, stream->bsdFilePtr, &stream->PALferrorCode); /* copy regular chars into buffer */
            if (stream->PALferrorCode == PAL_FILE_ERROR)
            {
                ERROR("fwrite() failed with errno == %d\n", errno);
                PERF_EXIT(vfprintf);
                va_end(ap);
                return -1;
            }
            ++written;
        }
    }

    va_end(ap);

    PERF_EXIT(vfprintf);
    return written;
}